

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O0

stack_st_TRUST_TOKEN_PRETOKEN *
voprf_blind(VOPRF_METHOD *method,CBB *cbb,size_t count,int include_message,uint8_t *msg,
           size_t msg_len)

{
  BN_ULONG *r_00;
  int iVar1;
  EC_GROUP *group_00;
  TRUST_TOKEN_PRETOKEN *p;
  size_t sVar2;
  undefined1 local_330 [8];
  EC_JACOBIAN Tp;
  EC_JACOBIAN P;
  EC_SCALAR r;
  TRUST_TOKEN_PRETOKEN *pretoken;
  size_t i;
  stack_st_TRUST_TOKEN_PRETOKEN *pretokens;
  EC_GROUP *group;
  SHA512_CTX hash_ctx;
  size_t msg_len_local;
  uint8_t *msg_local;
  int include_message_local;
  size_t count_local;
  CBB *cbb_local;
  VOPRF_METHOD *method_local;
  
  hash_ctx._208_8_ = msg_len;
  group_00 = (*method->group_func)();
  method_local = (VOPRF_METHOD *)sk_TRUST_TOKEN_PRETOKEN_new_null();
  if (method_local == (VOPRF_METHOD *)0x0) {
LAB_0075ec53:
    sk_TRUST_TOKEN_PRETOKEN_pop_free
              ((stack_st_TRUST_TOKEN_PRETOKEN *)method_local,TRUST_TOKEN_PRETOKEN_free);
    method_local = (VOPRF_METHOD *)0x0;
  }
  else {
    for (pretoken = (TRUST_TOKEN_PRETOKEN *)0x0; pretoken < count;
        pretoken = (TRUST_TOKEN_PRETOKEN *)(pretoken->salt + 1)) {
      p = (TRUST_TOKEN_PRETOKEN *)OPENSSL_malloc(0x158);
      if ((p == (TRUST_TOKEN_PRETOKEN *)0x0) ||
         (sVar2 = sk_TRUST_TOKEN_PRETOKEN_push((stack_st_TRUST_TOKEN_PRETOKEN *)method_local,p),
         sVar2 == 0)) {
        TRUST_TOKEN_PRETOKEN_free(p);
        goto LAB_0075ec53;
      }
      RAND_bytes((uchar *)p,0x40);
      if (include_message == 0) {
        OPENSSL_memcpy(p->t,p,0x40);
      }
      else {
        SHA512_Init((SHA512_CTX *)&group);
        SHA512_Update((SHA512_CTX *)&group,p,0x40);
        SHA512_Update((SHA512_CTX *)&group,msg,hash_ctx._208_8_);
        SHA512_Final(p->t,(SHA512_CTX *)&group);
      }
      iVar1 = ec_random_nonzero_scalar(group_00,(EC_SCALAR *)(P.Z.words + 8),"");
      if (iVar1 == 0) goto LAB_0075ec53;
      ec_scalar_inv0_montgomery(group_00,&p->r,(EC_SCALAR *)(P.Z.words + 8));
      r_00 = P.Z.words + 8;
      ec_scalar_from_montgomery(group_00,(EC_SCALAR *)r_00,(EC_SCALAR *)r_00);
      ec_scalar_from_montgomery(group_00,&p->r,&p->r);
      iVar1 = (*method->hash_to_group)(group_00,(EC_JACOBIAN *)(Tp.Z.words + 8),p->t);
      if ((((iVar1 == 0) ||
           (iVar1 = ec_point_mul_scalar(group_00,(EC_JACOBIAN *)local_330,
                                        (EC_JACOBIAN *)(Tp.Z.words + 8),(EC_SCALAR *)(P.Z.words + 8)
                                       ), iVar1 == 0)) ||
          (iVar1 = ec_jacobian_to_affine(group_00,&p->Tp,(EC_JACOBIAN *)local_330), iVar1 == 0)) ||
         (iVar1 = cbb_add_point(cbb,group_00,&p->Tp), iVar1 == 0)) goto LAB_0075ec53;
    }
  }
  return (stack_st_TRUST_TOKEN_PRETOKEN *)method_local;
}

Assistant:

static STACK_OF(TRUST_TOKEN_PRETOKEN) *voprf_blind(const VOPRF_METHOD *method,
                                                   CBB *cbb, size_t count,
                                                   int include_message,
                                                   const uint8_t *msg,
                                                   size_t msg_len) {
  SHA512_CTX hash_ctx;

  const EC_GROUP *group = method->group_func();
  STACK_OF(TRUST_TOKEN_PRETOKEN) *pretokens =
      sk_TRUST_TOKEN_PRETOKEN_new_null();
  if (pretokens == NULL) {
    goto err;
  }

  for (size_t i = 0; i < count; i++) {
    // Insert |pretoken| into |pretokens| early to simplify error-handling.
    TRUST_TOKEN_PRETOKEN *pretoken = reinterpret_cast<TRUST_TOKEN_PRETOKEN *>(
        OPENSSL_malloc(sizeof(TRUST_TOKEN_PRETOKEN)));
    if (pretoken == NULL ||
        !sk_TRUST_TOKEN_PRETOKEN_push(pretokens, pretoken)) {
      TRUST_TOKEN_PRETOKEN_free(pretoken);
      goto err;
    }

    RAND_bytes(pretoken->salt, sizeof(pretoken->salt));
    if (include_message) {
      assert(SHA512_DIGEST_LENGTH == TRUST_TOKEN_NONCE_SIZE);
      SHA512_Init(&hash_ctx);
      SHA512_Update(&hash_ctx, pretoken->salt, sizeof(pretoken->salt));
      SHA512_Update(&hash_ctx, msg, msg_len);
      SHA512_Final(pretoken->t, &hash_ctx);
    } else {
      OPENSSL_memcpy(pretoken->t, pretoken->salt, TRUST_TOKEN_NONCE_SIZE);
    }

    // We sample r in Montgomery form to simplify inverting.
    EC_SCALAR r;
    if (!ec_random_nonzero_scalar(group, &r, kDefaultAdditionalData)) {
      goto err;
    }

    // pretoken->r is rinv.
    ec_scalar_inv0_montgomery(group, &pretoken->r, &r);
    // Convert both out of Montgomery form.
    ec_scalar_from_montgomery(group, &r, &r);
    ec_scalar_from_montgomery(group, &pretoken->r, &pretoken->r);

    // Tp is the blinded token in the VOPRF protocol.
    EC_JACOBIAN P, Tp;
    if (!method->hash_to_group(group, &P, pretoken->t) ||
        !ec_point_mul_scalar(group, &Tp, &P, &r) ||
        !ec_jacobian_to_affine(group, &pretoken->Tp, &Tp)) {
      goto err;
    }

    if (!cbb_add_point(cbb, group, &pretoken->Tp)) {
      goto err;
    }
  }

  return pretokens;

err:
  sk_TRUST_TOKEN_PRETOKEN_pop_free(pretokens, TRUST_TOKEN_PRETOKEN_free);
  return NULL;
}